

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O2

void __thiscall
Model_cleanEmptyUnits_Test::Model_cleanEmptyUnits_Test(Model_cleanEmptyUnits_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_00134880;
  return;
}

Assistant:

TEST(Model, cleanEmptyUnits)
{
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"\">\n"
        "    <units units_ref=\"\" name=\"\"/>\n"
        "  </import>\n"
        "  <units name=\"u1\"/>\n"
        "  <units id=\"u2\"/>\n"
        "  <units>\n"
        "    <unit units=\"u4\"/>\n"
        "  </units>\n"
        "</model>\n";
    auto model = libcellml::Model::create();
    auto u1 = libcellml::Units::create("u1");
    auto u2 = libcellml::Units::create();
    u2->setId("u2");
    auto u3 = libcellml::Units::create();
    auto importSource = libcellml::ImportSource::create();
    u3->setImportSource(importSource);
    auto u4 = libcellml::Units::create();
    u4->addUnit("u4");
    auto u5 = libcellml::Units::create();
    model->addUnits(u1);
    model->addUnits(u2);
    model->addUnits(u3);
    model->addUnits(u4);
    model->addUnits(u5);

    EXPECT_EQ(size_t(5), model->unitsCount());
    // Call the Model::clean() function to remove empty components and units.
    model->clean();
    EXPECT_EQ(size_t(4), model->unitsCount());
    // Check the correct units is being cleaned.
    auto p = libcellml::Printer::create();
    EXPECT_EQ(e, p->printModel(model));
}